

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O0

void llama_sampler_xtc_reset(llama_sampler *smpl)

{
  long lVar1;
  uint32_t uVar2;
  result_type in_RDI;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *unaff_retaddr;
  llama_sampler_xtc *ctx;
  uint32_t in_stack_00002720;
  
  lVar1 = *(long *)(in_RDI + 8);
  uVar2 = get_rng_seed(in_stack_00002720);
  *(uint32_t *)(lVar1 + 0x14) = uVar2;
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(unaff_retaddr,in_RDI);
  return;
}

Assistant:

static void llama_sampler_xtc_reset(struct llama_sampler * smpl) {
    auto * ctx = (llama_sampler_xtc *) smpl->ctx;
    ctx->seed_cur = get_rng_seed(ctx->seed);
    ctx->rng.seed(ctx->seed_cur);
}